

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_12::PathVerifier::VerifyPolicies
          (PathVerifier *this,ParsedCertificate *cert,bool is_target_cert,CertErrors *errors)

{
  Span<const_unsigned_char> *pSVar1;
  Span<const_unsigned_char> policy;
  Input policy_00;
  Input policy_01;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *pvVar5;
  iterator __position;
  _Base_ptr p_Var6;
  byte bVar7;
  Span<const_unsigned_char> *pSVar8;
  Input rhs;
  Input p_oid;
  LevelDetails previous_level;
  _Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_88;
  _Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_68;
  _Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_48;
  
  bVar7 = cert->has_policy_oids_;
  if (((bool)bVar7 == true) &&
     (bVar3 = ValidPolicyGraph::IsNull(&this->valid_policy_graph_), !bVar3)) {
    ValidPolicyGraph::StartLevel(&previous_level,&this->valid_policy_graph_);
    pvVar5 = ParsedCertificate::policy_oids(cert);
    pSVar1 = &((pvVar5->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
               _M_impl.super__Vector_impl_data._M_finish)->data_;
    bVar3 = false;
    for (pSVar8 = &((pvVar5->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                    )._M_impl.super__Vector_impl_data._M_start)->data_; pSVar8 != pSVar1;
        pSVar8 = pSVar8 + 1) {
      p_oid.data_.data_ = pSVar8->data_;
      p_oid.data_.size_ = pSVar8->size_;
      rhs.data_.size_ = 4;
      rhs.data_.data_ = "U\x1d ";
      bVar4 = bssl::der::operator==((Input)*pSVar8,rhs);
      bVar2 = true;
      if (!bVar4) {
        __position = ::std::
                     _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                     ::find((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                             *)&previous_level,&p_oid);
        bVar2 = bVar3;
        if ((_Rb_tree_header *)__position._M_node ==
            &previous_level.expected_policy_map._M_t._M_impl.super__Rb_tree_header) {
          if (previous_level.has_any_policy == true) {
            policy_01.data_.size_ = p_oid.data_.size_;
            policy_01.data_.data_ = p_oid.data_.data_;
            local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ValidPolicyGraph::AddNode
                      (&this->valid_policy_graph_,policy_01,
                       (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&local_48);
            ::std::_Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~_Vector_base
                      (&local_48);
          }
        }
        else {
          policy_00.data_.size_ = p_oid.data_.size_;
          policy_00.data_.data_ = p_oid.data_.data_;
          local_68._M_impl.super__Vector_impl_data._M_start = (pointer)__position._M_node[1]._M_left
          ;
          local_68._M_impl.super__Vector_impl_data._M_finish =
               (pointer)__position._M_node[1]._M_right;
          local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
               *(pointer *)(__position._M_node + 2);
          __position._M_node[1]._M_left = (_Base_ptr)0x0;
          __position._M_node[1]._M_right = (_Base_ptr)0x0;
          *(undefined8 *)(__position._M_node + 2) = 0;
          ValidPolicyGraph::AddNode
                    (&this->valid_policy_graph_,policy_00,
                     (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&local_68);
          ::std::_Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~_Vector_base
                    (&local_68);
          ::std::
          _Rb_tree<bssl::der::Input,std::pair<bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>,std::_Select1st<std::pair<bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>>,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>>>
          ::erase_abi_cxx11_((_Rb_tree<bssl::der::Input,std::pair<bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>,std::_Select1st<std::pair<bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>>,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>>>
                              *)&previous_level,__position);
        }
      }
      bVar3 = bVar2;
    }
    if ((bVar3) &&
       ((this->inhibit_any_policy_ != 0 ||
        ((!is_target_cert && (bVar3 = IsSelfIssued(cert), bVar3)))))) {
      for (p_Var6 = previous_level.expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          (_Rb_tree_header *)p_Var6 !=
          &previous_level.expected_policy_map._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)::std::_Rb_tree_increment(p_Var6)) {
        policy = *(Span<const_unsigned_char> *)(p_Var6 + 1);
        local_88._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var6[1]._M_left;
        local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var6[1]._M_right;
        local_88._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(p_Var6 + 2);
        p_Var6[1]._M_left = (_Base_ptr)0x0;
        p_Var6[1]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(p_Var6 + 2) = 0;
        ValidPolicyGraph::AddNode
                  (&this->valid_policy_graph_,(Input)policy,
                   (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&local_88);
        ::std::_Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~_Vector_base
                  (&local_88);
      }
      if (previous_level.has_any_policy != false) {
        ValidPolicyGraph::AddAnyPolicyNode(&this->valid_policy_graph_);
      }
    }
    ::std::
    _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                 *)&previous_level);
    bVar7 = cert->has_policy_oids_;
  }
  if ((bVar7 & 1) == 0) {
    ValidPolicyGraph::SetNull(&this->valid_policy_graph_);
  }
  if ((this->explicit_policy_ == 0) &&
     (bVar3 = ValidPolicyGraph::IsNull(&this->valid_policy_graph_), bVar3)) {
    CertErrors::AddError(errors,"No valid policy");
  }
  return;
}

Assistant:

void PathVerifier::VerifyPolicies(const ParsedCertificate &cert,
                                  bool is_target_cert, CertErrors *errors) {
  // From RFC 5280 section 6.1.3:
  //
  //  (d)  If the certificate policies extension is present in the
  //       certificate and the valid_policy_tree is not NULL, process
  //       the policy information by performing the following steps in
  //       order:
  if (cert.has_policy_oids() && !valid_policy_graph_.IsNull()) {
    ValidPolicyGraph::LevelDetails previous_level =
        valid_policy_graph_.StartLevel();

    //     (1)  For each policy P not equal to anyPolicy in the
    //          certificate policies extension, let P-OID denote the OID
    //          for policy P and P-Q denote the qualifier set for policy
    //          P.  Perform the following steps in order:
    bool cert_has_any_policy = false;
    for (der::Input p_oid : cert.policy_oids()) {
      if (p_oid == der::Input(kAnyPolicyOid)) {
        cert_has_any_policy = true;
        continue;
      }

      //        (i)   For each node of depth i-1 in the valid_policy_tree
      //              where P-OID is in the expected_policy_set, create a
      //              child node as follows: set the valid_policy to P-OID,
      //              set the qualifier_set to P-Q, and set the
      //              expected_policy_set to {P-OID}.
      auto iter = previous_level.expected_policy_map.find(p_oid);
      if (iter != previous_level.expected_policy_map.end()) {
        valid_policy_graph_.AddNode(
            p_oid, /*parent_policies=*/std::move(iter->second));
        previous_level.expected_policy_map.erase(iter);
      } else if (previous_level.has_any_policy) {
        //      (ii)  If there was no match in step (i) and the
        //            valid_policy_tree includes a node of depth i-1 with
        //            the valid_policy anyPolicy, generate a child node with
        //            the following values: set the valid_policy to P-OID,
        //            set the qualifier_set to P-Q, and set the
        //            expected_policy_set to  {P-OID}.
        valid_policy_graph_.AddNodeWithParentAnyPolicy(p_oid);
      }
    }

    //     (2)  If the certificate policies extension includes the policy
    //          anyPolicy with the qualifier set AP-Q and either (a)
    //          inhibit_anyPolicy is greater than 0 or (b) i<n and the
    //          certificate is self-issued, then:
    //
    //          For each node in the valid_policy_tree of depth i-1, for
    //          each value in the expected_policy_set (including
    //          anyPolicy) that does not appear in a child node, create a
    //          child node with the following values: set the valid_policy
    //          to the value from the expected_policy_set in the parent
    //          node, set the qualifier_set to AP-Q, and set the
    //          expected_policy_set to the value in the valid_policy from
    //          this node.
    if (cert_has_any_policy && ((inhibit_any_policy_ > 0) ||
                                (!is_target_cert && IsSelfIssued(cert)))) {
      for (auto &[p_oid, parent_policies] :
           previous_level.expected_policy_map) {
        valid_policy_graph_.AddNode(p_oid, std::move(parent_policies));
      }
      if (previous_level.has_any_policy) {
        valid_policy_graph_.AddAnyPolicyNode();
      }
    }

    //     (3)  If there is a node in the valid_policy_tree of depth i-1
    //          or less without any child nodes, delete that node.  Repeat
    //          this step until there are no nodes of depth i-1 or less
    //          without children.
    //
    // This implementation does this as part of GetUserConstrainedPolicySet().
    // Only the current level needs to be pruned to compute the policy graph.
  }

  //  (e)  If the certificate policies extension is not present, set the
  //       valid_policy_tree to NULL.
  if (!cert.has_policy_oids()) {
    valid_policy_graph_.SetNull();
  }

  //  (f)  Verify that either explicit_policy is greater than 0 or the
  //       valid_policy_tree is not equal to NULL;
  if (!((explicit_policy_ > 0) || !valid_policy_graph_.IsNull())) {
    errors->AddError(cert_errors::kNoValidPolicy);
  }
}